

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O2

int google::protobuf::compiler::cpp::anon_unknown_0::FindMessageIndexInFile(Descriptor *descriptor)

{
  __normal_iterator<const_google::protobuf::Descriptor_**,_std::vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>_>
  _Var1;
  long in_RDI;
  vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
  flatten;
  _Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
  local_30;
  undefined1 local_18 [8];
  
  FlattenMessagesInFile
            ((vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
              *)&local_30,*(FileDescriptor **)(in_RDI + 0x10));
  _Var1 = std::
          __find_if<__gnu_cxx::__normal_iterator<google::protobuf::Descriptor_const**,std::vector<google::protobuf::Descriptor_const*,std::allocator<google::protobuf::Descriptor_const*>>>,__gnu_cxx::__ops::_Iter_equals_val<google::protobuf::Descriptor_const*const>>
                    (local_30._M_impl.super__Vector_impl_data._M_start,
                     local_30._M_impl.super__Vector_impl_data._M_finish,local_18);
  std::
  _Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
  ::~_Vector_base(&local_30);
  return (int)((ulong)((long)_Var1._M_current -
                      (long)local_30._M_impl.super__Vector_impl_data._M_start) >> 3);
}

Assistant:

int FindMessageIndexInFile(const Descriptor* descriptor) {
  std::vector<const Descriptor*> flatten =
      FlattenMessagesInFile(descriptor->file());
  return std::find(flatten.begin(), flatten.end(), descriptor) -
         flatten.begin();
}